

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

string * __thiscall
Assimp::B3DImporter::ReadChunk_abi_cxx11_(string *__return_storage_ptr__,B3DImporter *this)

{
  undefined8 in_RAX;
  int iVar1;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = 4;
  uStack_28 = in_RAX;
  do {
    ReadByte(this);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = ReadInt(this);
  uStack_28 = CONCAT44(iVar1 + this->_pos,(undefined4)uStack_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->_stack,(uint *)((long)&uStack_28 + 4));
  return __return_storage_ptr__;
}

Assistant:

string B3DImporter::ReadChunk(){
    string tag;
    for( int i=0;i<4;++i ){
        tag+=char( ReadByte() );
    }
#ifdef DEBUG_B3D
//	cout<<"ReadChunk:"<<tag<<endl;
#endif
    unsigned sz=(unsigned)ReadInt();
    _stack.push_back( _pos+sz );
    return tag;
}